

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O3

void __thiscall
Centaurus::CATNDepartureSetFactory<wchar_t>::closure_add
          (CATNDepartureSetFactory<wchar_t> *this,CATNClosure *closure,
          CATNDeparture<wchar_t> *departure)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  const_iterator __position;
  _Base_ptr p_Var3;
  const_iterator __result;
  _Self __tmp;
  int local_34;
  
  __position._M_node = (closure->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(closure->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)__position._M_node != p_Var1) {
    do {
      iVar2 = PriorityChain::compare
                        (&departure->m_priority,(PriorityChain *)&__position._M_node[2]._M_parent);
      if (0 < iVar2) {
        return;
      }
      __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
    } while ((_Rb_tree_header *)__position._M_node != p_Var1);
    __position._M_node = (closure->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  if ((_Rb_tree_header *)__position._M_node != p_Var1) {
    do {
      iVar2 = PriorityChain::compare
                        (&departure->m_priority,(PriorityChain *)&__position._M_node[2]._M_parent);
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
      if (iVar2 < 0) {
        std::
        _Rb_tree<Centaurus::CATNClosureElement,_Centaurus::CATNClosureElement,_std::_Identity<Centaurus::CATNClosureElement>,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>
        ::_M_erase_aux(&closure->_M_t,__position);
      }
      __position._M_node = p_Var3;
    } while ((_Rb_tree_header *)p_Var3 != p_Var1);
  }
  local_34 = departure->m_color;
  std::
  _Rb_tree<Centaurus::CATNClosureElement,Centaurus::CATNClosureElement,std::_Identity<Centaurus::CATNClosureElement>,std::less<Centaurus::CATNClosureElement>,std::allocator<Centaurus::CATNClosureElement>>
  ::_M_emplace_unique<Centaurus::ATNPath_const&,int,Centaurus::PriorityChain_const&>
            ((_Rb_tree<Centaurus::CATNClosureElement,Centaurus::CATNClosureElement,std::_Identity<Centaurus::CATNClosureElement>,std::less<Centaurus::CATNClosureElement>,std::allocator<Centaurus::CATNClosureElement>>
              *)closure,&departure->m_path,&local_34,&departure->m_priority);
  return;
}

Assistant:

void closure_add(CATNClosure& closure, const CATNDeparture<TCHAR>& departure) const
    {
        for (auto i = closure.cbegin(); i != closure.cend(); i++)
        {
            if (departure.priority().is_inferior_to(i->priority()))
            {
                //std::wcerr << L"Departure " << departure.label() << L":" << departure.priority() << L" by " << i->label() << L":" << i->priority() << std::endl;
                return;
            }
        }
        for (auto i = closure.begin(); i != closure.end();)
        {
            if (departure.priority().is_superior_to(i->priority()))
            {
                //std::wcerr << L"Departure " << i->label() << L":" << i->priority() << L" expelled by " << departure.label() << L":" << departure.priority() << std::endl;
                i = closure.erase(i);
            }
            else
            {
                i++;
            }
        }
        closure.emplace(departure.path(), departure.color(), departure.priority());
    }